

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O3

void __thiscall async_simple::coro::detail::LazyPromise<void>::result(LazyPromise<void> *this)

{
  undefined8 uVar1;
  void *local_10;
  
  local_10 = (this->_exception)._M_exception_object;
  if (local_10 == (void *)0x0) {
    return;
  }
  std::__exception_ptr::exception_ptr::_M_addref();
  uVar1 = std::rethrow_exception((exception_ptr)&local_10);
  if (local_10 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  _Unwind_Resume(uVar1);
}

Assistant:

void unhandled_exception() noexcept {
        _value.template emplace<std::exception_ptr>(std::current_exception());
    }